

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fs-poll.c
# Opt level: O1

void poll_cb(uv_fs_t *req)

{
  uv_handle_t *handle;
  long lVar1;
  int iVar2;
  uint64_t uVar3;
  ulong uVar4;
  
  handle = (uv_handle_t *)req[-1].statbuf.st_ctim.tv_nsec;
  iVar2 = uv_is_active(handle);
  if ((iVar2 != 0) && ((handle->flags & 3) == 0)) {
    lVar1 = req->result;
    if (lVar1 == 0) {
      iVar2 = (int)req[-1].statbuf.st_birthtim.tv_sec;
      if ((iVar2 != 0) &&
         (((((((iVar2 < 0 || (req[1].statbuf.st_uid != (req->statbuf).st_ctim.tv_nsec)) ||
              (req[1].statbuf.st_mode != (req->statbuf).st_mtim.tv_nsec)) ||
             ((req[1].statbuf.st_rdev != (req->statbuf).st_birthtim.tv_nsec ||
              (req[1].statbuf.st_nlink != (req->statbuf).st_ctim.tv_sec)))) ||
            ((req[1].statbuf.st_dev != (req->statbuf).st_mtim.tv_sec ||
             ((req[1].statbuf.st_gid != (req->statbuf).st_birthtim.tv_sec ||
              (req[1].reserved[5] != (void *)(req->statbuf).st_size)))))) ||
           (*(uint64_t *)&req[1].type != (req->statbuf).st_mode)) ||
          ((((req[1].reserved[1] != (void *)(req->statbuf).st_uid ||
             (req[1].reserved[2] != (void *)(req->statbuf).st_gid)) ||
            (req[1].reserved[4] != (void *)(req->statbuf).st_ino)) ||
           (((req[1].data != (void *)(req->statbuf).st_dev ||
             (req[1].cb != (uv_fs_cb)(req->statbuf).st_flags)) ||
            (req[1].result != (req->statbuf).st_gen)))))))) {
        (**(code **)&req[-1].file)(req[-1].statbuf.st_ctim.tv_nsec,0,req + 1);
      }
      memcpy(req + 1,&req->statbuf,0xa0);
      *(undefined4 *)&req[-1].statbuf.st_birthtim.tv_sec = 1;
    }
    else if (lVar1 != (int)req[-1].statbuf.st_birthtim.tv_sec) {
      (**(code **)&req[-1].file)(req[-1].statbuf.st_ctim.tv_nsec,lVar1,req + 1);
      *(int *)&req[-1].statbuf.st_birthtim.tv_sec = (int)req->result;
    }
  }
  uv_fs_req_cleanup(req);
  iVar2 = uv_is_active(handle);
  if ((iVar2 != 0) && ((handle->flags & 3) == 0)) {
    uVar4 = (ulong)*(uint *)((long)&req[-1].statbuf.st_birthtim.tv_sec + 4);
    uVar3 = uv_now((uv_loop_t *)req[-1].new_path);
    iVar2 = uv_timer_start((uv_timer_t *)&req[-1].mode,timer_cb,
                           uVar4 - (uVar3 - req[-1].statbuf.st_birthtim.tv_nsec) % uVar4,0);
    if (iVar2 == 0) {
      return;
    }
    abort();
  }
  uv_close((uv_handle_t *)&req[-1].mode,timer_close_cb);
  return;
}

Assistant:

static void poll_cb(uv_fs_t* req) {
  uv_stat_t* statbuf;
  struct poll_ctx* ctx;
  uint64_t interval;
  uv_fs_poll_t* handle;

  ctx = container_of(req, struct poll_ctx, fs_req);
  handle = ctx->parent_handle;

  if (!uv_is_active((uv_handle_t*)handle) || uv__is_closing(handle))
    goto out;

  if (req->result != 0) {
    if (ctx->busy_polling != req->result) {
      ctx->poll_cb(ctx->parent_handle,
                   req->result,
                   &ctx->statbuf,
                   &zero_statbuf);
      ctx->busy_polling = req->result;
    }
    goto out;
  }

  statbuf = &req->statbuf;

  if (ctx->busy_polling != 0)
    if (ctx->busy_polling < 0 || !statbuf_eq(&ctx->statbuf, statbuf))
      ctx->poll_cb(ctx->parent_handle, 0, &ctx->statbuf, statbuf);

  ctx->statbuf = *statbuf;
  ctx->busy_polling = 1;

out:
  uv_fs_req_cleanup(req);

  if (!uv_is_active((uv_handle_t*)handle) || uv__is_closing(handle)) {
    uv_close((uv_handle_t*)&ctx->timer_handle, timer_close_cb);
    return;
  }

  /* Reschedule timer, subtract the delay from doing the stat(). */
  interval = ctx->interval;
  interval -= (uv_now(ctx->loop) - ctx->start_time) % interval;

  if (uv_timer_start(&ctx->timer_handle, timer_cb, interval, 0))
    abort();
}